

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_2f6875::SerialQueueImpl::~SerialQueueImpl(SerialQueueImpl *this)

{
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  local_28 = (code *)0x0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  addOperation(this,(function<void_()> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  std::thread::join();
  std::condition_variable::~condition_variable(&this->readyOperationsCondition);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            (&this->operations);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            (&this->operationsThread);
  return;
}

Assistant:

~SerialQueueImpl() {
    // Signal the worker to shut down.
    addOperation({});

    // Wait for the worker to complete.
    operationsThread->join();
  }